

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ResetRenderTargets
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this)

{
  TextureViewGLImpl *pTVar1;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 rt_1;
  Uint32 rt;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  for (msg.field_2._12_4_ = 0; (uint)msg.field_2._12_4_ < this->m_NumBoundRenderTargets;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release
              (this->m_pBoundRenderTargets + (uint)msg.field_2._12_4_);
  }
  for (msg.field_2._8_4_ = this->m_NumBoundRenderTargets; (uint)msg.field_2._8_4_ < 8;
      msg.field_2._8_4_ = msg.field_2._8_4_ + 1) {
    pTVar1 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewGLImpl_
                       ((RefCntAutoPtr *)(this->m_pBoundRenderTargets + (uint)msg.field_2._8_4_));
    if (pTVar1 != (TextureViewGLImpl *)0x0) {
      FormatString<char[29]>((string *)local_38,(char (*) [29])"Non-null render target found");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"ResetRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5a2);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  this->m_DvpRenderTargetFormatsHash = 0;
  RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release(&this->m_pBoundDepthStencil);
  RefCntAutoPtr<Diligent::ITextureView>::Release(&this->m_pBoundShadingRateMap);
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::ResetRenderTargets()
{
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
        m_pBoundRenderTargets[rt].Release();
#ifdef DILIGENT_DEBUG
    for (Uint32 rt = m_NumBoundRenderTargets; rt < _countof(m_pBoundRenderTargets); ++rt)
    {
        VERIFY(m_pBoundRenderTargets[rt] == nullptr, "Non-null render target found");
    }
#endif
    m_NumBoundRenderTargets = 0;
    m_FramebufferWidth      = 0;
    m_FramebufferHeight     = 0;
    m_FramebufferSlices     = 0;
    m_FramebufferSamples    = 0;
#ifdef DILIGENT_DEVELOPMENT
    m_DvpRenderTargetFormatsHash = 0;
#endif

    m_pBoundDepthStencil.Release();
    m_pBoundShadingRateMap.Release();

    // Do not reset framebuffer here as there may potentially
    // be a subpass without any render target attachments.
}